

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
* active_var(map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
             *nodes)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  bool bVar1;
  int iVar2;
  BasicBlock *pBVar3;
  pointer ppVar4;
  reference ppBVar5;
  reference pvVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar10;
  element_type *peVar11;
  reference pvVar12;
  element_type *peVar13;
  element_type *peVar14;
  element_type *peVar15;
  element_type *peVar16;
  element_type *peVar17;
  size_type sVar18;
  iterator this;
  pointer ppVar19;
  ulong uVar20;
  ostream *this_00;
  ostream *this_01;
  reference piVar21;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  int __c_06;
  int __c_07;
  int __c_08;
  char *pcVar22;
  map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_bool>
  pVar23;
  pair<std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_bool>
  pVar24;
  iterator setit;
  iterator t;
  set<int,_std::less<int>,_std::allocator<int>_> s_2;
  int i_1;
  iterator iter_1;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  global;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> _in;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> _out;
  bool flag;
  VarId var;
  shared_ptr<mir::inst::JumpInstruction> ins_1;
  shared_ptr<mir::inst::PtrOffsetInst> in_7;
  shared_ptr<mir::inst::StoreInst> in_6;
  shared_ptr<mir::inst::LoadInst> in_5;
  shared_ptr<mir::inst::RefInst> in_4;
  VarId s_1;
  int k;
  shared_ptr<mir::inst::CallInst> in_3;
  shared_ptr<mir::inst::OpInst> in_2;
  VarId s;
  shared_ptr<mir::inst::AssignInst> in_1;
  shared_ptr<mir::inst::Inst> ins;
  int j;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> use1;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> def1;
  iterator it_1;
  int i;
  BasicBlock *p;
  iterator itt;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  vector<int,_std::allocator<int>_> visit;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> v;
  iterator iter;
  iterator it;
  BasicBlock *entry;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  out;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  in;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  use;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  def;
  map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *blocks;
  VarId *in_stack_ffffffffffffedd8;
  pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  *in_stack_ffffffffffffede0;
  value_type *in_stack_ffffffffffffede8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffedf0;
  undefined7 in_stack_ffffffffffffedf8;
  undefined1 in_stack_ffffffffffffedff;
  key_type *in_stack_ffffffffffffee18;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  *in_stack_ffffffffffffee20;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_stack_ffffffffffffee28;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_stack_ffffffffffffee30;
  mapped_type *in_stack_ffffffffffffee70;
  undefined7 in_stack_ffffffffffffee78;
  byte in_stack_ffffffffffffee7f;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_stack_ffffffffffffee80;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  *in_stack_ffffffffffffee90;
  undefined6 in_stack_ffffffffffffee98;
  undefined1 in_stack_ffffffffffffee9e;
  byte in_stack_ffffffffffffee9f;
  undefined6 in_stack_ffffffffffffeeb8;
  undefined1 in_stack_ffffffffffffeebe;
  byte in_stack_ffffffffffffeebf;
  byte bVar25;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  *in_stack_ffffffffffffeec0;
  undefined6 in_stack_ffffffffffffeec8;
  undefined1 in_stack_ffffffffffffeece;
  byte in_stack_ffffffffffffeecf;
  byte local_1121;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  *in_stack_ffffffffffffeee0;
  undefined7 in_stack_ffffffffffffeee8;
  undefined1 in_stack_ffffffffffffeeef;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *in_stack_ffffffffffffeef0;
  uint in_stack_ffffffffffffeefc;
  byte local_10e1;
  byte local_10b1;
  byte local_1071;
  byte local_1041;
  byte local_1001;
  byte local_fd1;
  byte local_f91;
  byte local_f61;
  byte local_f19;
  byte local_ee1;
  byte local_ea1;
  byte local_e59;
  byte local_e29;
  byte local_de1;
  _Self local_d08;
  _Base_ptr local_d00;
  _Rb_tree_const_iterator<int> local_cf8;
  _Self local_cf0;
  _Base_ptr local_ce8;
  _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  local_ce0;
  _Base_ptr local_cd8;
  _Base_ptr local_cd0;
  undefined1 local_cc8;
  int local_bdc;
  _Self local_bd8;
  _Base_ptr local_bd0;
  undefined1 local_bc1;
  _Base_ptr local_bc0;
  _Base_ptr local_bb8;
  undefined1 local_bb0;
  _Base_ptr local_b40;
  _Self local_b38;
  _Base_ptr local_b30;
  _Base_ptr local_af8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_ac0;
  _Base_ptr local_aa8;
  _Self local_9b0;
  _Base_ptr local_9a8;
  byte local_999;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_998 [2];
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_968 [2];
  byte local_901;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_8e8;
  byte local_8a9;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_890;
  byte local_851;
  byte local_7e9;
  byte local_791;
  byte local_729;
  byte local_6d1;
  byte local_669;
  byte local_611;
  byte local_5a9;
  byte local_541;
  int local_4fc;
  byte local_4d1;
  byte local_479;
  variant_alternative_t<1UL,_variant<int,_VarId>_> local_438;
  byte local_421;
  variant_alternative_t<1UL,_variant<int,_VarId>_> local_408 [4];
  byte local_3b9;
  byte local_351;
  variant_alternative_t<1UL,_variant<int,_VarId>_> local_300;
  int local_2ec;
  int *local_2b8;
  int *local_2b0;
  int *local_2a8;
  int *local_2a0;
  int local_294;
  BasicBlock *local_290;
  _Base_ptr local_288;
  _Base_ptr local_218;
  _Base_ptr local_210;
  undefined1 local_208;
  _Base_ptr local_1e0;
  undefined1 local_1d8;
  _Base_ptr local_1b0;
  undefined1 local_1a8;
  _Base_ptr local_180;
  undefined1 local_178;
  _Self local_138;
  _Base_ptr local_130;
  _Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> local_128;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
  local_120 [9];
  BasicBlock *local_d8;
  
  std::
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
         *)0x27a35f);
  std::
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
         *)0x27a36c);
  std::
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
         *)0x27a379);
  std::
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
         *)0x27a386);
  std::
  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  ::map((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
         *)in_stack_ffffffffffffede0,
        (map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
         *)in_stack_ffffffffffffedd8);
  pBVar3 = find_entry((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                       *)in_stack_ffffffffffffede0);
  std::
  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  ::~map((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
          *)0x27a3c1);
  local_d8 = pBVar3;
  std::
  _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
  ::_Rb_tree_iterator(local_120);
  std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::_Rb_tree_iterator
            (&local_128);
  local_130 = (_Base_ptr)
              std::
              map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
              ::begin((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                       *)in_stack_ffffffffffffedd8);
  local_1121 = in_stack_ffffffffffffeecf;
  local_128._M_node = local_130;
  while( true ) {
    local_138._M_node =
         (_Base_ptr)
         std::
         map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
         ::end((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                *)in_stack_ffffffffffffedd8);
    bVar1 = std::operator!=(&local_128,&local_138);
    if (!bVar1) break;
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x27a458);
    std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)0x27a465)
    ;
    std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>::
    pair<std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_&,_true>
              (in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x27a47d);
    pVar23 = std::
             map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::insert((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                       *)in_stack_ffffffffffffedf0._M_current,
                      (value_type *)in_stack_ffffffffffffede8);
    local_180 = (_Base_ptr)pVar23.first._M_node;
    local_178 = pVar23.second;
    std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>::~pair
              ((pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_> *
               )0x27a4d0);
    std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)0x27a4dd)
    ;
    std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>::
    pair<std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_&,_true>
              (in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x27a4f5);
    pVar23 = std::
             map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::insert((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                       *)in_stack_ffffffffffffedf0._M_current,
                      (value_type *)in_stack_ffffffffffffede8);
    local_1b0 = (_Base_ptr)pVar23.first._M_node;
    local_1a8 = pVar23.second;
    std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>::~pair
              ((pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_> *
               )0x27a548);
    std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)0x27a555)
    ;
    std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>::
    pair<std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_&,_true>
              (in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x27a56d);
    pVar23 = std::
             map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::insert((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                       *)in_stack_ffffffffffffedf0._M_current,
                      (value_type *)in_stack_ffffffffffffede8);
    local_1e0 = (_Base_ptr)pVar23.first._M_node;
    local_1d8 = pVar23.second;
    std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>::~pair
              ((pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_> *
               )0x27a5c0);
    std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)0x27a5cd)
    ;
    std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>::
    pair<std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_&,_true>
              (in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x27a5e5);
    pVar23 = std::
             map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::insert((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                       *)in_stack_ffffffffffffedf0._M_current,
                      (value_type *)in_stack_ffffffffffffede8);
    local_210 = (_Base_ptr)pVar23.first._M_node;
    local_208 = pVar23.second;
    std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>::~pair
              ((pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_> *
               )0x27a638);
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               in_stack_ffffffffffffedf0._M_current);
    local_218 = (_Base_ptr)
                std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
                operator++((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>
                            *)in_stack_ffffffffffffede8,
                           (int)((ulong)in_stack_ffffffffffffede0 >> 0x20));
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x27a762);
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)in_stack_ffffffffffffede0);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffedf0._M_current,
             (value_type_conflict3 *)in_stack_ffffffffffffede8);
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)in_stack_ffffffffffffede0,
             (value_type *)in_stack_ffffffffffffedd8);
  while (bVar1 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                           ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x27a7ae),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x27a7d6);
    local_288 = (_Base_ptr)
                std::
                map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                ::find((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                        *)in_stack_ffffffffffffedd8,(key_type *)0x27a7f5);
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
             operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                        0x27a81c);
    local_290 = ppVar4->second;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x27a835);
    for (local_294 = 0; uVar20 = (ulong)local_294,
        sVar18 = std::
                 vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                 ::size(&local_290->nextBlock), uVar20 < sVar18; local_294 = local_294 + 1) {
      local_2a8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffedd8);
      local_2b0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffedd8);
      std::vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>::
      operator[](&local_290->nextBlock,(long)local_294);
      __first._M_current._7_1_ = in_stack_ffffffffffffedff;
      __first._M_current._0_7_ = in_stack_ffffffffffffedf8;
      local_2a0 = (int *)std::
                         find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                                   (__first,in_stack_ffffffffffffedf0,
                                    (int *)in_stack_ffffffffffffede8);
      local_2b8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffedd8);
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffede0,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffedd8);
      if (bVar1) {
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x27a934);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x27a941);
        local_2ec = 0;
        while( true ) {
          uVar20 = (ulong)local_2ec;
          ppBVar5 = std::
                    vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                    ::operator[](&local_290->nextBlock,(long)local_294);
          sVar18 = std::
                   vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                   ::size(&(*ppBVar5)->inst);
          if (sVar18 <= uVar20) break;
          ppBVar5 = std::
                    vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                    ::operator[](&local_290->nextBlock,(long)local_294);
          pcVar22 = (char *)(long)local_2ec;
          pvVar6 = std::
                   vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                   ::operator[](&(*ppBVar5)->inst,(size_type)pcVar22);
          pcVar22 = std::
                    variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                    ::index(pvVar6,pcVar22,__c);
          if (pcVar22 == (char *)0x0) {
            ppBVar5 = std::
                      vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                      ::operator[](&local_290->nextBlock,(long)local_294);
            std::
            vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
            ::operator[](&(*ppBVar5)->inst,(long)local_2ec);
            std::
            get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                      ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                        *)0x27aa09);
            std::shared_ptr<mir::inst::Inst>::shared_ptr
                      ((shared_ptr<mir::inst::Inst> *)in_stack_ffffffffffffede0,
                       (shared_ptr<mir::inst::Inst> *)in_stack_ffffffffffffedd8);
            peVar7 = std::
                     __shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x27aa3d);
            iVar2 = (*(peVar7->super_Displayable)._vptr_Displayable[1])();
            if (iVar2 == 0) {
              pvVar10 = &local_300;
              std::static_pointer_cast<mir::inst::AssignInst,mir::inst::Inst>
                        ((shared_ptr<mir::inst::Inst> *)in_stack_ffffffffffffede8);
              peVar8 = std::
                       __shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x27aa84);
              pcVar22 = std::variant<int,_mir::inst::VarId>::index
                                  ((variant<int,_mir::inst::VarId> *)&(peVar8->src).field_0x8,
                                   (char *)pvVar10,__c_00);
              if (pcVar22 == (char *)0x1) {
                local_351 = 0;
                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                          (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                std::
                __shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x27aaca);
                std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x27aad6);
                mir::inst::VarId::VarId
                          ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 CONCAT17(in_stack_ffffffffffffedff,in_stack_ffffffffffffedf8),
                                 (VarId *)in_stack_ffffffffffffedf0._M_current);
                local_de1 = 0;
                if (!bVar1) {
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                            (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                  local_351 = 1;
                  std::
                  __shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x27ab62);
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x27ab6e);
                  mir::inst::VarId::VarId
                            ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                  bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   CONCAT17(in_stack_ffffffffffffedff,in_stack_ffffffffffffedf8),
                                   (VarId *)in_stack_ffffffffffffedf0._M_current);
                  local_de1 = bVar1 ^ 0xff;
                }
                if ((local_351 & 1) != 0) {
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             in_stack_ffffffffffffedf0._M_current);
                }
                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                          ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                           in_stack_ffffffffffffedf0._M_current);
                if ((local_de1 & 1) != 0) {
                  std::
                  __shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x27ac14);
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x27ac20);
                  mir::inst::VarId::VarId
                            ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             in_stack_ffffffffffffedf0._M_current,&in_stack_ffffffffffffede8->first)
                  ;
                }
              }
              local_3b9 = 0;
              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                        (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
              std::
              __shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x27ad65);
              mir::inst::VarId::VarId((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
              bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               CONCAT17(in_stack_ffffffffffffedff,in_stack_ffffffffffffedf8),
                               (VarId *)in_stack_ffffffffffffedf0._M_current);
              local_e29 = 0;
              if (!bVar1) {
                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                          (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                local_3b9 = 1;
                std::
                __shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x27ade2);
                mir::inst::VarId::VarId
                          ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 CONCAT17(in_stack_ffffffffffffedff,in_stack_ffffffffffffedf8),
                                 (VarId *)in_stack_ffffffffffffedf0._M_current);
                local_e29 = bVar1 ^ 0xff;
              }
              if ((local_3b9 & 1) != 0) {
                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                          ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                           in_stack_ffffffffffffedf0._M_current);
              }
              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                        ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                         in_stack_ffffffffffffedf0._M_current);
              if ((local_e29 & 1) != 0) {
                std::
                __shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mir::inst::AssignInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x27ae7a);
                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                          ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                           in_stack_ffffffffffffedf0._M_current,&in_stack_ffffffffffffede8->first);
              }
              std::shared_ptr<mir::inst::AssignInst>::~shared_ptr
                        ((shared_ptr<mir::inst::AssignInst> *)0x27aef3);
            }
            else {
              peVar7 = std::
                       __shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x27af17);
              iVar2 = (*(peVar7->super_Displayable)._vptr_Displayable[1])();
              if (iVar2 == 1) {
                pvVar10 = &local_300;
                std::static_pointer_cast<mir::inst::OpInst,mir::inst::Inst>
                          ((shared_ptr<mir::inst::Inst> *)in_stack_ffffffffffffede8);
                peVar9 = std::
                         __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x27af5e);
                pcVar22 = std::variant<int,_mir::inst::VarId>::index
                                    ((variant<int,_mir::inst::VarId> *)&(peVar9->lhs).field_0x8,
                                     (char *)pvVar10,__c_01);
                if (pcVar22 == (char *)0x1) {
                  local_421 = 0;
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                            (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                  std::
                  __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x27afa4);
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x27afb0);
                  pvVar10 = local_408;
                  mir::inst::VarId::VarId
                            ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                  bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   CONCAT17(in_stack_ffffffffffffedff,in_stack_ffffffffffffedf8),
                                   (VarId *)in_stack_ffffffffffffedf0._M_current);
                  local_e59 = 0;
                  if (!bVar1) {
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                    local_421 = 1;
                    std::
                    __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x27b03c);
                    std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x27b048);
                    pvVar10 = &local_438;
                    mir::inst::VarId::VarId
                              ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                    bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     CONCAT17(in_stack_ffffffffffffedff,in_stack_ffffffffffffedf8),
                                     (VarId *)in_stack_ffffffffffffedf0._M_current);
                    local_e59 = bVar1 ^ 0xff;
                  }
                  if ((local_421 & 1) != 0) {
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               in_stack_ffffffffffffedf0._M_current);
                  }
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             in_stack_ffffffffffffedf0._M_current);
                  if ((local_e59 & 1) != 0) {
                    std::
                    __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x27b0ee);
                    pvVar10 = std::get<1ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)0x27b0fa);
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               in_stack_ffffffffffffedf0._M_current,
                               &in_stack_ffffffffffffede8->first);
                  }
                }
                peVar9 = std::
                         __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x27b19c);
                pcVar22 = std::variant<int,_mir::inst::VarId>::index
                                    ((variant<int,_mir::inst::VarId> *)&(peVar9->rhs).field_0x8,
                                     (char *)pvVar10,__c_02);
                if (pcVar22 == (char *)0x1) {
                  local_479 = 0;
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                            (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                  std::
                  __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x27b1e2);
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x27b1ee);
                  mir::inst::VarId::VarId
                            ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                  bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   CONCAT17(in_stack_ffffffffffffedff,in_stack_ffffffffffffedf8),
                                   (VarId *)in_stack_ffffffffffffedf0._M_current);
                  local_ea1 = 0;
                  if (!bVar1) {
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                    local_479 = 1;
                    std::
                    __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x27b27a);
                    std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x27b286);
                    mir::inst::VarId::VarId
                              ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                    bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     CONCAT17(in_stack_ffffffffffffedff,in_stack_ffffffffffffedf8),
                                     (VarId *)in_stack_ffffffffffffedf0._M_current);
                    local_ea1 = bVar1 ^ 0xff;
                  }
                  if ((local_479 & 1) != 0) {
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               in_stack_ffffffffffffedf0._M_current);
                  }
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             in_stack_ffffffffffffedf0._M_current);
                  if ((local_ea1 & 1) != 0) {
                    std::
                    __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x27b32c);
                    std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x27b338);
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               in_stack_ffffffffffffedf0._M_current,
                               &in_stack_ffffffffffffede8->first);
                  }
                }
                local_4d1 = 0;
                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                          (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                std::
                __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x27b3e0);
                mir::inst::VarId::VarId
                          ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 CONCAT17(in_stack_ffffffffffffedff,in_stack_ffffffffffffedf8),
                                 (VarId *)in_stack_ffffffffffffedf0._M_current);
                local_ee1 = 0;
                if (!bVar1) {
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                            (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                  local_4d1 = 1;
                  std::
                  __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x27b45d);
                  mir::inst::VarId::VarId
                            ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                  bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   CONCAT17(in_stack_ffffffffffffedff,in_stack_ffffffffffffedf8),
                                   (VarId *)in_stack_ffffffffffffedf0._M_current);
                  local_ee1 = bVar1 ^ 0xff;
                }
                if ((local_4d1 & 1) != 0) {
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             in_stack_ffffffffffffedf0._M_current);
                }
                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                          ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                           in_stack_ffffffffffffedf0._M_current);
                if ((local_ee1 & 1) != 0) {
                  std::
                  __shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x27b4f5);
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             in_stack_ffffffffffffedf0._M_current,&in_stack_ffffffffffffede8->first)
                  ;
                }
                std::shared_ptr<mir::inst::OpInst>::~shared_ptr
                          ((shared_ptr<mir::inst::OpInst> *)0x27b56e);
              }
              else {
                peVar7 = std::
                         __shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x27b592);
                iVar2 = (*(peVar7->super_Displayable)._vptr_Displayable[1])();
                if (iVar2 == 6) {
                  std::static_pointer_cast<mir::inst::CallInst,mir::inst::Inst>
                            ((shared_ptr<mir::inst::Inst> *)in_stack_ffffffffffffede8);
                  local_4fc = 0;
                  while( true ) {
                    uVar20 = (ulong)local_4fc;
                    peVar11 = std::
                              __shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x27b5f4);
                    sVar18 = std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::size
                                       (&peVar11->params);
                    if (sVar18 <= uVar20) break;
                    peVar11 = std::
                              __shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x27b621);
                    pcVar22 = (char *)(long)local_4fc;
                    pvVar12 = std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::
                              operator[](&peVar11->params,(size_type)pcVar22);
                    pcVar22 = std::variant<int,_mir::inst::VarId>::index
                                        ((variant<int,_mir::inst::VarId> *)&pvVar12->field_0x8,
                                         pcVar22,__c_03);
                    if (pcVar22 == (char *)0x1) {
                      local_541 = 0;
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                      peVar11 = std::
                                __shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x27b677);
                      std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
                                (&peVar11->params,(long)local_4fc);
                      std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x27b697)
                      ;
                      mir::inst::VarId::VarId
                                ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                      bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)CONCAT17(in_stack_ffffffffffffedff,
                                                   in_stack_ffffffffffffedf8),
                                       (VarId *)in_stack_ffffffffffffedf0._M_current);
                      local_f19 = 0;
                      if (!bVar1) {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                        local_541 = 1;
                        peVar11 = std::
                                  __shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)0x27b723);
                        std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
                                  (&peVar11->params,(long)local_4fc);
                        std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)0x27b743);
                        mir::inst::VarId::VarId
                                  ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                        bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          *)CONCAT17(in_stack_ffffffffffffedff,
                                                     in_stack_ffffffffffffedf8),
                                         (VarId *)in_stack_ffffffffffffedf0._M_current);
                        local_f19 = bVar1 ^ 0xff;
                      }
                      if ((local_541 & 1) != 0) {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   in_stack_ffffffffffffedf0._M_current);
                      }
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 in_stack_ffffffffffffedf0._M_current);
                      if ((local_f19 & 1) != 0) {
                        peVar11 = std::
                                  __shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)0x27b7e9);
                        std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
                                  (&peVar11->params,(long)local_4fc);
                        std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)0x27b809);
                        mir::inst::VarId::VarId
                                  ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   in_stack_ffffffffffffedf0._M_current,
                                   &in_stack_ffffffffffffede8->first);
                      }
                    }
                    local_4fc = local_4fc + 1;
                  }
                  local_5a9 = 0;
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                            (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                  std::
                  __shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x27b8ff);
                  mir::inst::VarId::VarId
                            ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                  bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   CONCAT17(in_stack_ffffffffffffedff,in_stack_ffffffffffffedf8),
                                   (VarId *)in_stack_ffffffffffffedf0._M_current);
                  local_f61 = 0;
                  if (!bVar1) {
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                    local_5a9 = 1;
                    std::
                    __shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x27b97c);
                    mir::inst::VarId::VarId
                              ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                    bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     CONCAT17(in_stack_ffffffffffffedff,in_stack_ffffffffffffedf8),
                                     (VarId *)in_stack_ffffffffffffedf0._M_current);
                    local_f61 = bVar1 ^ 0xff;
                  }
                  if ((local_5a9 & 1) != 0) {
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               in_stack_ffffffffffffedf0._M_current);
                  }
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             in_stack_ffffffffffffedf0._M_current);
                  if ((local_f61 & 1) != 0) {
                    std::
                    __shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x27ba14);
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               in_stack_ffffffffffffedf0._M_current,
                               &in_stack_ffffffffffffede8->first);
                  }
                  std::shared_ptr<mir::inst::CallInst>::~shared_ptr
                            ((shared_ptr<mir::inst::CallInst> *)0x27ba8d);
                }
                else {
                  peVar7 = std::
                           __shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x27bab1);
                  iVar2 = (*(peVar7->super_Displayable)._vptr_Displayable[1])();
                  if (iVar2 == 2) {
                    pvVar10 = &local_300;
                    std::static_pointer_cast<mir::inst::RefInst,mir::inst::Inst>
                              ((shared_ptr<mir::inst::Inst> *)in_stack_ffffffffffffede8);
                    peVar13 = std::
                              __shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x27baf8);
                    pcVar22 = std::
                              variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::index(&peVar13->val,(char *)pvVar10,__c_04);
                    if (pcVar22 == (char *)0x0) {
                      local_611 = 0;
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                      std::
                      __shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x27bb3a);
                      std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)0x27bb46);
                      mir::inst::VarId::VarId
                                ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                      bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)CONCAT17(in_stack_ffffffffffffedff,
                                                   in_stack_ffffffffffffedf8),
                                       (VarId *)in_stack_ffffffffffffedf0._M_current);
                      local_f91 = 0;
                      if (!bVar1) {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                        local_611 = 1;
                        std::
                        __shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x27bbd2);
                        std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                  ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)0x27bbde);
                        mir::inst::VarId::VarId
                                  ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                        bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          *)CONCAT17(in_stack_ffffffffffffedff,
                                                     in_stack_ffffffffffffedf8),
                                         (VarId *)in_stack_ffffffffffffedf0._M_current);
                        local_f91 = bVar1 ^ 0xff;
                      }
                      if ((local_611 & 1) != 0) {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   in_stack_ffffffffffffedf0._M_current);
                      }
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 in_stack_ffffffffffffedf0._M_current);
                      if ((local_f91 & 1) != 0) {
                        std::
                        __shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x27bc84);
                        std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                  ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)0x27bc90);
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   in_stack_ffffffffffffedf0._M_current,
                                   &in_stack_ffffffffffffede8->first);
                      }
                    }
                    local_669 = 0;
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                    std::
                    __shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x27bd51);
                    mir::inst::VarId::VarId
                              ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                    bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     CONCAT17(in_stack_ffffffffffffedff,in_stack_ffffffffffffedf8),
                                     (VarId *)in_stack_ffffffffffffedf0._M_current);
                    local_fd1 = 0;
                    if (!bVar1) {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                      local_669 = 1;
                      std::
                      __shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x27bdce);
                      mir::inst::VarId::VarId
                                ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                      bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)CONCAT17(in_stack_ffffffffffffedff,
                                                   in_stack_ffffffffffffedf8),
                                       (VarId *)in_stack_ffffffffffffedf0._M_current);
                      local_fd1 = bVar1 ^ 0xff;
                    }
                    if ((local_669 & 1) != 0) {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 in_stack_ffffffffffffedf0._M_current);
                    }
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               in_stack_ffffffffffffedf0._M_current);
                    if ((local_fd1 & 1) != 0) {
                      std::
                      __shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x27be66);
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 in_stack_ffffffffffffedf0._M_current,
                                 &in_stack_ffffffffffffede8->first);
                    }
                    std::shared_ptr<mir::inst::RefInst>::~shared_ptr
                              ((shared_ptr<mir::inst::RefInst> *)0x27bedf);
                  }
                  else {
                    peVar7 = std::
                             __shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x27bf03);
                    iVar2 = (*(peVar7->super_Displayable)._vptr_Displayable[1])();
                    if (iVar2 == 3) {
                      pvVar10 = &local_300;
                      std::static_pointer_cast<mir::inst::LoadInst,mir::inst::Inst>
                                ((shared_ptr<mir::inst::Inst> *)in_stack_ffffffffffffede8);
                      peVar14 = std::
                                __shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x27bf4a);
                      pcVar22 = std::variant<int,_mir::inst::VarId>::index
                                          ((variant<int,_mir::inst::VarId> *)
                                           &(peVar14->src).field_0x8,(char *)pvVar10,__c_05);
                      if (pcVar22 == (char *)0x1) {
                        local_6d1 = 0;
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                        std::
                        __shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x27bf90);
                        std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)0x27bf9c);
                        mir::inst::VarId::VarId
                                  ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                        bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          *)CONCAT17(in_stack_ffffffffffffedff,
                                                     in_stack_ffffffffffffedf8),
                                         (VarId *)in_stack_ffffffffffffedf0._M_current);
                        local_1001 = 0;
                        if (!bVar1) {
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                    (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                          local_6d1 = 1;
                          std::
                          __shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x27c028);
                          std::get<1ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)0x27c034);
                          mir::inst::VarId::VarId
                                    ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                          bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            *)CONCAT17(in_stack_ffffffffffffedff,
                                                       in_stack_ffffffffffffedf8),
                                           (VarId *)in_stack_ffffffffffffedf0._M_current);
                          local_1001 = bVar1 ^ 0xff;
                        }
                        if ((local_6d1 & 1) != 0) {
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     in_stack_ffffffffffffedf0._M_current);
                        }
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   in_stack_ffffffffffffedf0._M_current);
                        if ((local_1001 & 1) != 0) {
                          std::
                          __shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x27c0da);
                          std::get<1ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)0x27c0e6);
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                          push_back((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                    in_stack_ffffffffffffedf0._M_current,
                                    &in_stack_ffffffffffffede8->first);
                        }
                      }
                      local_729 = 0;
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                      std::
                      __shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x27c1a7);
                      mir::inst::VarId::VarId
                                ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                      bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)CONCAT17(in_stack_ffffffffffffedff,
                                                   in_stack_ffffffffffffedf8),
                                       (VarId *)in_stack_ffffffffffffedf0._M_current);
                      local_1041 = 0;
                      if (!bVar1) {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                        local_729 = 1;
                        std::
                        __shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x27c224);
                        mir::inst::VarId::VarId
                                  ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                        bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          *)CONCAT17(in_stack_ffffffffffffedff,
                                                     in_stack_ffffffffffffedf8),
                                         (VarId *)in_stack_ffffffffffffedf0._M_current);
                        local_1041 = bVar1 ^ 0xff;
                      }
                      if ((local_729 & 1) != 0) {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   in_stack_ffffffffffffedf0._M_current);
                      }
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 in_stack_ffffffffffffedf0._M_current);
                      if ((local_1041 & 1) != 0) {
                        std::
                        __shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mir::inst::LoadInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x27c2bc);
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   in_stack_ffffffffffffedf0._M_current,
                                   &in_stack_ffffffffffffede8->first);
                      }
                      std::shared_ptr<mir::inst::LoadInst>::~shared_ptr
                                ((shared_ptr<mir::inst::LoadInst> *)0x27c335);
                    }
                    else {
                      peVar7 = std::
                               __shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)0x27c359);
                      iVar2 = (*(peVar7->super_Displayable)._vptr_Displayable[1])();
                      if (iVar2 == 4) {
                        pvVar10 = &local_300;
                        std::static_pointer_cast<mir::inst::StoreInst,mir::inst::Inst>
                                  ((shared_ptr<mir::inst::Inst> *)in_stack_ffffffffffffede8);
                        peVar15 = std::
                                  __shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)0x27c3a0);
                        pcVar22 = std::variant<int,_mir::inst::VarId>::index
                                            ((variant<int,_mir::inst::VarId> *)
                                             &(peVar15->val).field_0x8,(char *)pvVar10,__c_06);
                        if (pcVar22 == (char *)0x1) {
                          local_791 = 0;
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                    (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                          std::
                          __shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x27c3e6);
                          std::get<1ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)0x27c3f2);
                          mir::inst::VarId::VarId
                                    ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                          bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            *)CONCAT17(in_stack_ffffffffffffedff,
                                                       in_stack_ffffffffffffedf8),
                                           (VarId *)in_stack_ffffffffffffedf0._M_current);
                          local_1071 = 0;
                          if (!bVar1) {
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                      (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                            local_791 = 1;
                            std::
                            __shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x27c47e);
                            std::get<1ul,int,mir::inst::VarId>
                                      ((variant<int,_mir::inst::VarId> *)0x27c48a);
                            mir::inst::VarId::VarId
                                      ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8)
                            ;
                            bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              *)CONCAT17(in_stack_ffffffffffffedff,
                                                         in_stack_ffffffffffffedf8),
                                             (VarId *)in_stack_ffffffffffffedf0._M_current);
                            local_1071 = bVar1 ^ 0xff;
                          }
                          if ((local_791 & 1) != 0) {
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                            ~vector((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                    in_stack_ffffffffffffedf0._M_current);
                          }
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     in_stack_ffffffffffffedf0._M_current);
                          if ((local_1071 & 1) != 0) {
                            std::
                            __shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x27c530);
                            std::get<1ul,int,mir::inst::VarId>
                                      ((variant<int,_mir::inst::VarId> *)0x27c53c);
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                            push_back((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *
                                      )in_stack_ffffffffffffedf0._M_current,
                                      &in_stack_ffffffffffffede8->first);
                          }
                        }
                        local_7e9 = 0;
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                        std::
                        __shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x27c5fd);
                        mir::inst::VarId::VarId
                                  ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                        bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          *)CONCAT17(in_stack_ffffffffffffedff,
                                                     in_stack_ffffffffffffedf8),
                                         (VarId *)in_stack_ffffffffffffedf0._M_current);
                        local_10b1 = 0;
                        if (!bVar1) {
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                    (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                          local_7e9 = 1;
                          std::
                          __shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x27c67a);
                          mir::inst::VarId::VarId
                                    ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                          bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            *)CONCAT17(in_stack_ffffffffffffedff,
                                                       in_stack_ffffffffffffedf8),
                                           (VarId *)in_stack_ffffffffffffedf0._M_current);
                          local_10b1 = bVar1 ^ 0xff;
                        }
                        if ((local_7e9 & 1) != 0) {
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     in_stack_ffffffffffffedf0._M_current);
                        }
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   in_stack_ffffffffffffedf0._M_current);
                        if ((local_10b1 & 1) != 0) {
                          std::
                          __shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mir::inst::StoreInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x27c712);
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                          push_back((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                    in_stack_ffffffffffffedf0._M_current,
                                    &in_stack_ffffffffffffede8->first);
                        }
                        std::shared_ptr<mir::inst::StoreInst>::~shared_ptr
                                  ((shared_ptr<mir::inst::StoreInst> *)0x27c78b);
                      }
                      else {
                        peVar7 = std::
                                 __shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 ::operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                               *)0x27c7af);
                        iVar2 = (*(peVar7->super_Displayable)._vptr_Displayable[1])();
                        if (iVar2 == 5) {
                          pvVar10 = &local_300;
                          std::static_pointer_cast<mir::inst::PtrOffsetInst,mir::inst::Inst>
                                    ((shared_ptr<mir::inst::Inst> *)in_stack_ffffffffffffede8);
                          peVar16 = std::
                                    __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)0x27c7f6);
                          pcVar22 = std::variant<int,_mir::inst::VarId>::index
                                              ((variant<int,_mir::inst::VarId> *)
                                               &(peVar16->offset).field_0x8,(char *)pvVar10,__c_07);
                          if (pcVar22 == (char *)0x1) {
                            local_851 = 0;
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                      (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                            std::
                            __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x27c83c);
                            std::get<1ul,int,mir::inst::VarId>
                                      ((variant<int,_mir::inst::VarId> *)0x27c848);
                            mir::inst::VarId::VarId
                                      ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8)
                            ;
                            bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              *)CONCAT17(in_stack_ffffffffffffedff,
                                                         in_stack_ffffffffffffedf8),
                                             (VarId *)in_stack_ffffffffffffedf0._M_current);
                            local_10e1 = 0;
                            if (!bVar1) {
                              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                              vector(in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                              local_851 = 1;
                              std::
                              __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x27c8d4);
                              std::get<1ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)0x27c8e0);
                              mir::inst::VarId::VarId
                                        ((VarId *)in_stack_ffffffffffffede0,
                                         in_stack_ffffffffffffedd8);
                              bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                *)CONCAT17(in_stack_ffffffffffffedff,
                                                           in_stack_ffffffffffffedf8),
                                               (VarId *)in_stack_ffffffffffffedf0._M_current);
                              local_10e1 = bVar1 ^ 0xff;
                            }
                            in_stack_ffffffffffffeefc =
                                 CONCAT13(local_10e1,(int3)in_stack_ffffffffffffeefc);
                            if ((local_851 & 1) != 0) {
                              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                              ~vector((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *
                                      )in_stack_ffffffffffffedf0._M_current);
                            }
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                            ~vector((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                    in_stack_ffffffffffffedf0._M_current);
                            if ((in_stack_ffffffffffffeefc & 0x1000000) != 0) {
                              std::
                              __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x27c986);
                              in_stack_ffffffffffffeef0 =
                                   std::get<1ul,int,mir::inst::VarId>
                                             ((variant<int,_mir::inst::VarId> *)0x27c992);
                              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                              push_back((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         *)in_stack_ffffffffffffedf0._M_current,
                                        &in_stack_ffffffffffffede8->first);
                            }
                          }
                          local_8a9 = 0;
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                    (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                          std::
                          __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x27ca53);
                          in_stack_ffffffffffffeee0 = &local_890;
                          mir::inst::VarId::VarId
                                    ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                          in_stack_ffffffffffffeeef =
                               has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         *)CONCAT17(in_stack_ffffffffffffedff,
                                                    in_stack_ffffffffffffedf8),
                                        (VarId *)in_stack_ffffffffffffedf0._M_current);
                          local_1121 = 0;
                          if (!(bool)in_stack_ffffffffffffeeef) {
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                      (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                            local_8a9 = 1;
                            std::
                            __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x27cad0);
                            mir::inst::VarId::VarId
                                      ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8)
                            ;
                            bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              *)CONCAT17(in_stack_ffffffffffffedff,
                                                         in_stack_ffffffffffffedf8),
                                             (VarId *)in_stack_ffffffffffffedf0._M_current);
                            local_1121 = bVar1 ^ 0xff;
                          }
                          if ((local_8a9 & 1) != 0) {
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                            ~vector((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                    in_stack_ffffffffffffedf0._M_current);
                          }
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     in_stack_ffffffffffffedf0._M_current);
                          if ((local_1121 & 1) != 0) {
                            std::
                            __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x27cb68);
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                            push_back((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *
                                      )in_stack_ffffffffffffedf0._M_current,
                                      &in_stack_ffffffffffffede8->first);
                          }
                          local_901 = 0;
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                    (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                          std::
                          __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x27cc03);
                          in_stack_ffffffffffffeec0 = &local_8e8;
                          mir::inst::VarId::VarId
                                    ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                          in_stack_ffffffffffffeece =
                               has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         *)CONCAT17(in_stack_ffffffffffffedff,
                                                    in_stack_ffffffffffffedf8),
                                        (VarId *)in_stack_ffffffffffffedf0._M_current);
                          bVar25 = 0;
                          if (!(bool)in_stack_ffffffffffffeece) {
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                      (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                            local_901 = 1;
                            std::
                            __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x27cc80);
                            mir::inst::VarId::VarId
                                      ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8)
                            ;
                            in_stack_ffffffffffffeebe =
                                 has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           *)CONCAT17(in_stack_ffffffffffffedff,
                                                      in_stack_ffffffffffffedf8),
                                          (VarId *)in_stack_ffffffffffffedf0._M_current);
                            bVar25 = in_stack_ffffffffffffeebe ^ 0xff;
                          }
                          in_stack_ffffffffffffeebf = bVar25;
                          if ((local_901 & 1) != 0) {
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                            ~vector((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                    in_stack_ffffffffffffedf0._M_current);
                          }
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     in_stack_ffffffffffffedf0._M_current);
                          if ((bVar25 & 1) != 0) {
                            std::
                            __shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mir::inst::PtrOffsetInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x27cd18);
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                            push_back((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *
                                      )in_stack_ffffffffffffedf0._M_current,
                                      &in_stack_ffffffffffffede8->first);
                          }
                          std::shared_ptr<mir::inst::PtrOffsetInst>::~shared_ptr
                                    ((shared_ptr<mir::inst::PtrOffsetInst> *)0x27cd91);
                        }
                      }
                    }
                  }
                }
              }
            }
            std::shared_ptr<mir::inst::Inst>::~shared_ptr((shared_ptr<mir::inst::Inst> *)0x27cdbd);
          }
          else {
            ppBVar5 = std::
                      vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                      ::operator[](&local_290->nextBlock,(long)local_294);
            pcVar22 = (char *)(long)local_2ec;
            pvVar6 = std::
                     vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                     ::operator[](&(*ppBVar5)->inst,(size_type)pcVar22);
            pcVar22 = std::
                      variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      ::index(pvVar6,pcVar22,__c_08);
            if (pcVar22 == (char *)0x1) {
              ppBVar5 = std::
                        vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                        ::operator[](&local_290->nextBlock,(long)local_294);
              std::
              vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
              ::operator[](&(*ppBVar5)->inst,(long)local_2ec);
              std::
              get<1ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                        ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                          *)0x27ce48);
              std::shared_ptr<mir::inst::JumpInstruction>::shared_ptr
                        ((shared_ptr<mir::inst::JumpInstruction> *)in_stack_ffffffffffffede0,
                         (shared_ptr<mir::inst::JumpInstruction> *)in_stack_ffffffffffffedd8);
              peVar17 = std::
                        __shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x27ce74);
              if ((peVar17->kind == BrCond) ||
                 (peVar17 = std::
                            __shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x27ce87), peVar17->kind == Return)) {
                mir::inst::VarId::VarId((VarId *)in_stack_ffffffffffffede0);
                std::
                __shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x27cead);
                bVar1 = std::optional::operator_cast_to_bool((optional<mir::inst::VarId> *)0x27ceb9)
                ;
                local_968[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._7_1_ = 0;
                local_998[0].super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
                in_stack_ffffffffffffee7f = 0;
                if (bVar1) {
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                            (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                  local_968[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._7_1_ = 1;
                  std::
                  __shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x27cf0a);
                  std::optional<mir::inst::VarId>::operator*((optional<mir::inst::VarId> *)0x27cf16)
                  ;
                  in_stack_ffffffffffffee90 = local_968;
                  mir::inst::VarId::VarId
                            ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                  in_stack_ffffffffffffee9e =
                       has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                CONCAT17(in_stack_ffffffffffffedff,in_stack_ffffffffffffedf8),
                                (VarId *)in_stack_ffffffffffffedf0._M_current);
                  in_stack_ffffffffffffee7f = 0;
                  if (!(bool)in_stack_ffffffffffffee9e) {
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
                    local_998[0].
                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
                    std::
                    __shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x27cf93);
                    std::optional<mir::inst::VarId>::operator*
                              ((optional<mir::inst::VarId> *)0x27cf9f);
                    in_stack_ffffffffffffee80 = local_998;
                    mir::inst::VarId::VarId
                              ((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
                    bVar1 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     CONCAT17(in_stack_ffffffffffffedff,in_stack_ffffffffffffedf8),
                                     (VarId *)in_stack_ffffffffffffedf0._M_current);
                    in_stack_ffffffffffffee7f = bVar1 ^ 0xff;
                  }
                }
                in_stack_ffffffffffffee9f = in_stack_ffffffffffffee7f;
                if ((local_998[0].
                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             in_stack_ffffffffffffedf0._M_current);
                }
                if ((local_968[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._7_1_ & 1)
                    != 0) {
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             in_stack_ffffffffffffedf0._M_current);
                }
                if ((in_stack_ffffffffffffee7f & 1) != 0) {
                  std::
                  __shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x27d042);
                  std::optional<mir::inst::VarId>::operator*((optional<mir::inst::VarId> *)0x27d04e)
                  ;
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             in_stack_ffffffffffffedf0._M_current,&in_stack_ffffffffffffede8->first)
                  ;
                }
              }
              std::shared_ptr<mir::inst::JumpInstruction>::~shared_ptr
                        ((shared_ptr<mir::inst::JumpInstruction> *)0x27d0e7);
            }
          }
          local_2ec = local_2ec + 1;
        }
        std::vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
        ::operator[](&local_290->nextBlock,(long)local_294);
        in_stack_ffffffffffffee70 =
             std::
             map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::operator[](in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=
                  (in_stack_ffffffffffffee80,
                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                   CONCAT17(in_stack_ffffffffffffee7f,in_stack_ffffffffffffee78));
        std::vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
        ::operator[](&local_290->nextBlock,(long)local_294);
        std::
        map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
        ::operator[](in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=
                  (in_stack_ffffffffffffee80,
                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                   CONCAT17(in_stack_ffffffffffffee7f,in_stack_ffffffffffffee78));
        std::vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
        ::operator[](&local_290->nextBlock,(long)local_294);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffedf0._M_current,
                   (value_type_conflict3 *)in_stack_ffffffffffffede8);
        std::vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
        ::operator[](&local_290->nextBlock,(long)local_294);
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)in_stack_ffffffffffffede0,
                   (value_type *)in_stack_ffffffffffffedd8);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                   in_stack_ffffffffffffedf0._M_current);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                   in_stack_ffffffffffffedf0._M_current);
      }
    }
  }
  local_999 = 1;
  while ((local_999 & 1) != 0) {
    local_999 = 0;
    local_9a8 = (_Base_ptr)
                std::
                map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                ::begin((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                         *)in_stack_ffffffffffffedd8);
    local_128._M_node = local_9a8;
    while( true ) {
      local_9b0._M_node =
           (_Base_ptr)
           std::
           map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
           ::end((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                  *)in_stack_ffffffffffffedd8);
      bVar1 = std::operator!=(&local_128,&local_9b0);
      if (!bVar1) break;
      std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                 0x27d2da);
      std::
      map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             *)in_stack_ffffffffffffede0,
            (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             *)in_stack_ffffffffffffedd8);
      calcu_out((BasicBlock *)
                CONCAT17(in_stack_ffffffffffffee9f,
                         CONCAT16(in_stack_ffffffffffffee9e,in_stack_ffffffffffffee98)),
                in_stack_ffffffffffffee90);
      std::
      map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
              *)0x27d329);
      std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                 0x27d336);
      std::
      map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::operator[](in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=
                (in_stack_ffffffffffffee80,
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 CONCAT17(in_stack_ffffffffffffee7f,in_stack_ffffffffffffee78));
      std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                 0x27d374);
      std::
      map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             *)in_stack_ffffffffffffede0,
            (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             *)in_stack_ffffffffffffedd8);
      std::
      map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             *)in_stack_ffffffffffffede0,
            (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             *)in_stack_ffffffffffffedd8);
      std::
      map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             *)in_stack_ffffffffffffede0,
            (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             *)in_stack_ffffffffffffedd8);
      calcu_in(in_stack_ffffffffffffeefc,
               (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *)in_stack_ffffffffffffeef0,
               (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffeeef,in_stack_ffffffffffffeee8),
               in_stack_ffffffffffffeee0);
      std::
      map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
              *)0x27d3f7);
      std::
      map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
              *)0x27d404);
      std::
      map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
              *)0x27d411);
      std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                 0x27d41e);
      local_aa8 = (_Base_ptr)
                  std::
                  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::find((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                          *)in_stack_ffffffffffffedd8,(key_type *)0x27d42e);
      local_120[0]._M_node = local_aa8;
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                    *)0x27d476);
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
      vectors_difference((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                         CONCAT17(in_stack_ffffffffffffee7f,in_stack_ffffffffffffee78),
                         in_stack_ffffffffffffee70);
      sVar18 = std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::size(&local_ac0);
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 in_stack_ffffffffffffedf0._M_current);
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 in_stack_ffffffffffffedf0._M_current);
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 in_stack_ffffffffffffedf0._M_current);
      if (sVar18 != 0) {
        local_999 = 1;
        std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                   0x27d508);
        std::
        map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
        ::operator[](in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=
                  (in_stack_ffffffffffffee80,
                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                   CONCAT17(in_stack_ffffffffffffee7f,in_stack_ffffffffffffee78));
      }
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 in_stack_ffffffffffffedf0._M_current);
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 in_stack_ffffffffffffedf0._M_current);
      local_af8 = (_Base_ptr)
                  std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
                  operator++((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>
                              *)in_stack_ffffffffffffede8,
                             (int)((ulong)in_stack_ffffffffffffede0 >> 0x20));
    }
  }
  std::
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
         *)0x27d6a6);
  local_b30 = (_Base_ptr)
              std::
              map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::begin((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                       *)in_stack_ffffffffffffedd8);
  local_120[0]._M_node = local_b30;
  while( true ) {
    local_b38._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
         ::end((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *)in_stack_ffffffffffffedd8);
    bVar1 = std::operator!=(local_120,&local_b38);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                  *)0x27d70b);
    this = std::
           map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
           ::find((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                   *)in_stack_ffffffffffffedd8,(key_type *)0x27d71b);
    local_b40 = this._M_node;
    ppVar19 = std::
              _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                            *)0x27d741);
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                  *)0x27d750);
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)this._M_node,
               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)ppVar19);
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                  *)0x27d773);
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)this._M_node,
               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)ppVar19);
    vectors_intersection
              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               CONCAT17(in_stack_ffffffffffffee7f,in_stack_ffffffffffffee78),
               in_stack_ffffffffffffee70);
    std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>::
    pair<std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_true>
              (in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x27d7c2);
    pVar23 = std::
             map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::insert((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                       *)in_stack_ffffffffffffedf0._M_current,
                      (value_type *)in_stack_ffffffffffffede8);
    local_bb8 = (_Base_ptr)pVar23.first._M_node;
    local_bb0 = pVar23.second;
    std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>::~pair
              ((pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_> *
               )0x27d809);
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               in_stack_ffffffffffffedf0._M_current);
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               in_stack_ffffffffffffedf0._M_current);
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               in_stack_ffffffffffffedf0._M_current);
    local_bc0 = (_Base_ptr)
                std::
                _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                              *)in_stack_ffffffffffffede8,
                             (int)((ulong)in_stack_ffffffffffffede0 >> 0x20));
  }
  local_bc1 = 0;
  std::
  map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::map((map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         *)0x27d909);
  local_bd0 = (_Base_ptr)
              std::
              map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::begin((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                       *)in_stack_ffffffffffffedd8);
  local_120[0]._M_node = local_bd0;
  while( true ) {
    local_bd8._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
         ::end((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *)in_stack_ffffffffffffedd8);
    bVar1 = std::operator!=(local_120,&local_bd8);
    if (!bVar1) break;
    ppVar19 = std::
              _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                            *)0x27d96e);
    sVar18 = std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::size
                       (&ppVar19->second);
    if (sVar18 != 0) {
      local_bdc = 0;
      while( true ) {
        uVar20 = (ulong)local_bdc;
        ppVar19 = std::
                  _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                                *)0x27d9a9);
        sVar18 = std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::size
                           (&ppVar19->second);
        if (sVar18 <= uVar20) break;
        ppVar19 = std::
                  _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                                *)0x27d9d3);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator[]
                  (&ppVar19->second,(long)local_bdc);
        mir::inst::VarId::VarId((VarId *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
        std::
        map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
        ::map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
               *)in_stack_ffffffffffffede0,
              (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
               *)in_stack_ffffffffffffedd8);
        std::
        map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
        ::map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
               *)in_stack_ffffffffffffede0,
              (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
               *)in_stack_ffffffffffffedd8);
        blockHasVar((VarId *)CONCAT17(local_1121,
                                      CONCAT16(in_stack_ffffffffffffeece,in_stack_ffffffffffffeec8))
                    ,in_stack_ffffffffffffeec0,
                    (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffeebf,
                                CONCAT16(in_stack_ffffffffffffeebe,in_stack_ffffffffffffeeb8)));
        std::
        map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
        ::~map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *)0x27da59);
        std::
        map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
        ::~map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *)0x27da66);
        ppVar19 = std::
                  _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                                *)0x27da73);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator[]
                  (&ppVar19->second,(long)local_bdc);
        std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>::
        pair<mir::inst::VarId_&,_std::set<int,_std::less<int>,_std::allocator<int>_>_&,_true>
                  ((pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
                    *)in_stack_ffffffffffffedf0._M_current,&in_stack_ffffffffffffede8->first,
                   (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffede0);
        pVar24 = std::
                 map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 ::insert((map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                           *)in_stack_ffffffffffffedf0._M_current,in_stack_ffffffffffffede8);
        local_cd0 = (_Base_ptr)pVar24.first._M_node;
        local_cc8 = pVar24.second;
        std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>::
        ~pair((pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
              0x27dae6);
        std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)0x27daf3);
        local_bdc = local_bdc + 1;
      }
    }
    local_cd8 = (_Base_ptr)
                std::
                _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                              *)in_stack_ffffffffffffede8,
                             (int)((ulong)in_stack_ffffffffffffede0 >> 0x20));
  }
  this_00 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  this_01 = std::operator<<(this_00,"*** desplay blocks ***");
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::
  _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::_Rb_tree_iterator(&local_ce0);
  local_ce8 = (_Base_ptr)
              std::
              map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              ::begin((map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                       *)in_stack_ffffffffffffedd8);
  local_ce0._M_node = local_ce8;
  while( true ) {
    local_cf0._M_node =
         (_Base_ptr)
         std::
         map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         ::end((map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)in_stack_ffffffffffffedd8);
    bVar1 = std::operator!=(&local_ce0,&local_cf0);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)0x27dc8b);
    prelude::operator<<((ostream *)in_stack_ffffffffffffede0,
                        &in_stack_ffffffffffffedd8->super_Displayable);
    std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_cf8);
    std::
    _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)0x27dcb6);
    local_d00 = (_Base_ptr)
                std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_ffffffffffffedd8);
    local_cf8._M_node = local_d00;
    while( true ) {
      std::
      _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    *)0x27dce7);
      local_d08._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffedd8);
      bVar1 = std::operator!=(&local_cf8,&local_d08);
      if (!bVar1) break;
      in_stack_ffffffffffffede0 =
           (pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_> *)
           std::operator<<((ostream *)&std::cout," ");
      piVar21 = std::_Rb_tree_const_iterator<int>::operator*
                          ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffede0);
      std::ostream::operator<<(in_stack_ffffffffffffede0,*piVar21);
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)this_01,
                 (int)((ulong)in_stack_ffffffffffffede0 >> 0x20));
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)this_01,(int)((ulong)in_stack_ffffffffffffede0 >> 0x20));
  }
  local_bc1 = 1;
  std::
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          *)0x27ddc8);
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)0x27ddd5);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          *)0x27ddef);
  std::
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          *)0x27ddfc);
  std::
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          *)0x27de09);
  std::
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~map((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          *)0x27de16);
  return in_RDI;
}

Assistant:

map<mir::inst::VarId, set<int>> active_var(map<int, BasicBlock*> nodes) {
  map<int, vector<mir::inst::VarId>> def;
  map<int, vector<mir::inst::VarId>> use;
  map<int, vector<mir::inst::VarId>> in;
  map<int, vector<mir::inst::VarId>> out;
  BasicBlock* entry = find_entry(nodes);
  map<int, vector<mir::inst::VarId>>::iterator it;
  // step0: initialization
  map<int, BasicBlock*>::iterator iter;
  for (iter = nodes.begin(); iter != nodes.end(); iter++) {
    vector<mir::inst::VarId> v;
    def.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
    use.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
    in.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
    out.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
  }
  // step1: Find the def and use variables for each block
  // BFS
  vector<int> visit;
  std::queue<int> q;
  visit.push_back(entry->id);
  q.push(entry->id);
  while (!q.empty()) {
    map<int, BasicBlock*>::iterator itt = nodes.find(q.front());
    BasicBlock* p = itt->second;
    q.pop();
    for (int i = 0; i < p->nextBlock.size(); i++) {
      vector<int>::iterator it =
          find(visit.begin(), visit.end(), p->nextBlock[i]->id);
      if (it == visit.end()) {
        vector<mir::inst::VarId> def1;
        vector<mir::inst::VarId> use1;
        for (int j = 0; j < p->nextBlock[i]->inst.size(); j++) {
          if (p->nextBlock[i]->inst[j].index() == 0) {
            shared_ptr<mir::inst::Inst> ins = get<0>(p->nextBlock[i]->inst[j]);
            if (ins->inst_kind() == mir::inst::InstKind::Assign) {
              shared_ptr<mir::inst::AssignInst> in =
                  std::static_pointer_cast<mir::inst::AssignInst>(ins);
              if (in->src.index() == 1) {
                if (!has_this(use1, get<1>(in->src)) &&
                    !has_this(def1, get<1>(in->src))) {
                  mir::inst::VarId s = get<1>(in->src);
                  use1.push_back(s);
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Op) {
              shared_ptr<mir::inst::OpInst> in =
                  std::static_pointer_cast<mir::inst::OpInst>(ins);
              if (in->lhs.index() == 1) {
                if (!has_this(use1, get<1>(in->lhs)) &&
                    !has_this(def1, get<1>(in->lhs))) {
                  use1.push_back(get<1>(in->lhs));
                }
              }
              if (in->rhs.index() == 1) {
                if (!has_this(use1, get<1>(in->rhs)) &&
                    !has_this(def1, get<1>(in->rhs))) {
                  use1.push_back(get<1>(in->rhs));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Call) {
              shared_ptr<mir::inst::CallInst> in =
                  std::static_pointer_cast<mir::inst::CallInst>(ins);
              for (int k = 0; k < in->params.size(); k++) {
                if (in->params[k].index() == 1) {
                  if (!has_this(use1, get<1>(in->params[k])) &&
                      !has_this(def1, get<1>(in->params[k]))) {
                    mir::inst::VarId s = get<1>(in->params[k]);
                    use1.push_back(s);
                  }
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Ref) {
              shared_ptr<mir::inst::RefInst> in =
                  std::static_pointer_cast<mir::inst::RefInst>(ins);
              if (in->val.index() == 0) {
                if (!has_this(use1, get<0>(in->val)) &&
                    !has_this(def1, get<0>(in->val))) {
                  use1.push_back(get<0>(in->val));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Load) {
              shared_ptr<mir::inst::LoadInst> in =
                  std::static_pointer_cast<mir::inst::LoadInst>(ins);
              if (in->src.index() == 1) {
                if (!has_this(use1, get<1>(in->src)) &&
                    !has_this(def1, get<1>(in->src))) {
                  use1.push_back(get<1>(in->src));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Store) {
              shared_ptr<mir::inst::StoreInst> in =
                  std::static_pointer_cast<mir::inst::StoreInst>(ins);
              if (in->val.index() == 1) {
                if (!has_this(use1, get<1>(in->val)) &&
                    !has_this(def1, get<1>(in->val))) {
                  use1.push_back(get<1>(in->val));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::PtrOffset) {
              shared_ptr<mir::inst::PtrOffsetInst> in =
                  std::static_pointer_cast<mir::inst::PtrOffsetInst>(ins);
              if (in->offset.index() == 1) {
                if (!has_this(use1, get<1>(in->offset)) &&
                    !has_this(def1, get<1>(in->offset))) {
                  use1.push_back(get<1>(in->offset));
                }
              }
              if (!has_this(use1, in->ptr) && !has_this(def1, in->ptr)) {
                use1.push_back(in->ptr);
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else {
              // nothing
            }
          } else if (p->nextBlock[i]->inst[j].index() == 1) {
            shared_ptr<mir::inst::JumpInstruction> ins =
                get<1>(p->nextBlock[i]->inst[j]);
            if (ins->kind == mir::inst::JumpInstructionKind::BrCond ||
                ins->kind == mir::inst::JumpInstructionKind::Return) {
              mir::inst::VarId var;
              if (ins->cond_or_ret && !has_this(use1, *ins->cond_or_ret) &&
                  !has_this(def1, *ins->cond_or_ret)) {
                use1.push_back(*ins->cond_or_ret);
              }
            }
          }
        }
        def[p->nextBlock[i]->id] = def1;
        use[p->nextBlock[i]->id] = use1;
        visit.push_back(p->nextBlock[i]->id);
        q.push(p->nextBlock[i]->id);
      }
    }
  }
  // output for test
  /*for (it = def.begin(); it != def.end(); it++) {
      cout << "def " << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }
  for (it = use.begin(); it != use .end(); it++) {
      cout << "use " << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }*/

  // step2: fill the in and out
  bool flag = true;
  while (flag) {
    flag = false;
    for (iter = nodes.begin(); iter != nodes.end(); iter++) {
      // cout << "|" << iter->second->id << endl;
      vector<mir::inst::VarId> _out = calcu_out(iter->second, in);
      out[iter->first] = _out;
      vector<mir::inst::VarId> _in = calcu_in(iter->first, use, out, def);
      it = in.find(iter->first);
      if (vectors_difference(_in, it->second).size() != 0) {
        flag = true;
        in[iter->first] = _in;
      }
    }
  }
  // output for test
  /*for (it = in.begin(); it != in.end(); it++) {
      cout << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }
  for (it = out.begin(); it != out.end(); it++) {
      cout << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }*/

  // step3: find the global var -- def && out
  map<int, vector<mir::inst::VarId>> global;
  for (it = def.begin(); it != def.end(); it++) {
    map<int, vector<mir::inst::VarId>>::iterator iter = out.find(it->first);
    global.insert(map<int, vector<mir::inst::VarId>>::value_type(
        it->first, vectors_intersection(it->second, iter->second)));
  }
  // output for test
  /*cout << endl << "*** desplay global var ***" << endl;
  for (it = global.begin(); it != global.end(); it++) {
      cout << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }*/

  // step4: build the blocks.
  map<mir::inst::VarId, set<int>> blocks;
  // mir::inst::VarId s0(0);
  for (it = global.begin(); it != global.end(); it++) {
    if (it->second.size() > 0) {
      for (int i = 0; i < it->second.size(); i++) {
        // if (it->second[i] != s0) {
        set<int> s = blockHasVar(it->second[i], def, use);
        blocks.insert(
            map<mir::inst::VarId, set<int>>::value_type(it->second[i], s));
        //}
      }
    }
  }
  cout << endl << "*** desplay blocks ***" << endl;
  map<mir::inst::VarId, set<int>>::iterator t;
  for (t = blocks.begin(); t != blocks.end(); t++) {
    cout << t->first;
    set<int>::iterator setit;
    for (setit = t->second.begin(); setit != t->second.end(); setit++) {
      cout << " " << *setit;
    }
    cout << endl;
  }
  return blocks;
}